

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * vdbeSorterFlushThread(void *pCtx)

{
  int iVar1;
  
  iVar1 = vdbeSorterListToPMA((SortSubtask *)pCtx,(SorterList *)((long)pCtx + 0x20));
  *(undefined4 *)((long)pCtx + 8) = 1;
  return (void *)(long)iVar1;
}

Assistant:

static void *vdbeSorterFlushThread(void *pCtx){
  SortSubtask *pTask = (SortSubtask*)pCtx;
  int rc;                         /* Return code */
  assert( pTask->bDone==0 );
  rc = vdbeSorterListToPMA(pTask, &pTask->list);
  pTask->bDone = 1;
  return SQLITE_INT_TO_PTR(rc);
}